

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char **in_stack_000003b0;
  int in_stack_000003bc;
  SceneLoadingTutorialApplication *in_stack_000003c0;
  TutorialBenchmark *in_stack_fffffffffffffa80;
  Tutorial *in_stack_fffffffffffffac0;
  char **in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffb98;
  char **in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbac;
  TutorialBenchmark *in_stack_fffffffffffffbb0;
  BenchFunc in_stack_fffffffffffffdc8;
  TutorialBenchmark *in_stack_fffffffffffffdd0;
  allocator local_f9;
  string local_f8 [244];
  int local_4;
  
  local_4 = 0;
  bVar1 = embree::TutorialBenchmark::benchmark(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  if (bVar1) {
    embree::TutorialBenchmark::TutorialBenchmark
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"hair_geometry",&local_f9);
    local_4 = embree::TutorialBenchmark::main
                        (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                         in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    embree::TutorialBenchmark::~TutorialBenchmark(in_stack_fffffffffffffa80);
  }
  else {
    embree::Tutorial::Tutorial(in_stack_fffffffffffffac0);
    local_4 = embree::SceneLoadingTutorialApplication::main
                        (in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
    embree::Tutorial::~Tutorial((Tutorial *)0x11c338);
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  if (embree::TutorialBenchmark::benchmark(argc, argv)) {
    return embree::TutorialBenchmark(embree::renderBenchFunc<embree::Tutorial>).main(argc, argv, "hair_geometry");
  }
  return embree::Tutorial().main(argc,argv);
}